

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O2

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  if (this != sb) {
    resize(this,sb->bufferSize);
    memcpy(this->heap,sb->heap,sb->bufferSize);
  }
  return this;
}

Assistant:

SmallBuffer& operator=(const SmallBuffer& sb)
    {
        if (this == &sb) {
            return *this;
        }
        resize(sb.size());
        std::memcpy(heap, sb.heap, sb.size());
        return *this;
    }